

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::EnumGenerator::GenerateMethods
          (EnumGenerator *this,int idx,Printer *printer)

{
  size_t *psVar1;
  int iVar2;
  bool bVar3;
  __type _Var4;
  uint uVar5;
  int iVar6;
  FileDescriptor *pFVar7;
  uint *puVar8;
  string *psVar9;
  reference args;
  reference __k;
  mapped_type *pmVar10;
  Descriptor *pDVar11;
  EnumValueDescriptor *this_00;
  undefined1 qualified;
  ulong uVar12;
  int number;
  EnumValueDescriptor *enum_value;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar13;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_bool>
  pVar14;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar15;
  string local_2a0;
  int local_27c;
  undefined1 local_278 [4];
  int i_2;
  string parent;
  pair<const_int,_int> *p_2;
  iterator __end4_2;
  iterator __begin4_2;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *__range4_2;
  unsigned_long local_220;
  reference local_218;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *p_1;
  iterator __end4_1;
  iterator __begin4_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__range4_1;
  undefined1 local_1f0 [4];
  int data_index;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> number_to_index;
  int i;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *p;
  iterator __end4;
  iterator __begin4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__range4;
  _Base_ptr local_190;
  undefined1 local_188;
  int local_17c;
  _Base_ptr local_178;
  undefined1 local_170;
  int local_164;
  EnumValueDescriptor *local_160;
  EnumValueDescriptor *value_1;
  undefined1 local_150 [4];
  int i_1;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  number_to_canonical_name;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  name_to_number;
  _Self local_d0;
  _Self local_c8;
  iterator iter;
  int local_ac;
  EnumValueDescriptor *local_a8;
  EnumValueDescriptor *value;
  undefined1 local_98 [4];
  int j;
  set<int,_std::less<int>,_std::allocator<int>_> numbers;
  undefined1 local_58 [8];
  Formatter format;
  Printer *printer_local;
  EnumGenerator *pEStack_10;
  int idx_local;
  EnumGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  printer_local._4_4_ = idx;
  pEStack_10 = this;
  Formatter::Formatter((Formatter *)local_58,printer,&this->variables_);
  pFVar7 = EnumDescriptor::file(this->descriptor_);
  bVar3 = HasDescriptorMethods(pFVar7,this->options_);
  if (bVar3) {
    Formatter::operator()
              ((Formatter *)local_58,
               "const ::$proto_ns$::EnumDescriptor* $classname$_descriptor() {\n  ::$proto_ns$::internal::AssignDescriptors(&$desc_table$);\n  return $file_level_enum_descriptors$[$1$];\n}\n"
               ,(int *)((long)&printer_local + 4));
  }
  Formatter::operator()<>
            ((Formatter *)local_58,"bool $classname$_IsValid(int value) {\n  switch (value) {\n");
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
  value._4_4_ = 0;
  while( true ) {
    iVar2 = value._4_4_;
    uVar5 = EnumDescriptor::value_count(this->descriptor_);
    uVar12 = (ulong)uVar5;
    if ((int)uVar5 <= iVar2) break;
    local_a8 = EnumDescriptor::value(this->descriptor_,value._4_4_);
    local_ac = EnumValueDescriptor::number(local_a8);
    pVar13 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)local_98,&local_ac);
    iter._M_node = (_Base_ptr)pVar13.first._M_node;
    value._4_4_ = value._4_4_ + 1;
  }
  local_c8._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
  while( true ) {
    local_d0._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
    bVar3 = std::operator!=(&local_c8,&local_d0);
    qualified = (undefined1)uVar12;
    if (!bVar3) break;
    puVar8 = (uint *)std::_Rb_tree_const_iterator<int>::operator*(&local_c8);
    Int32ToString_abi_cxx11_
              ((string *)&name_to_number._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (cpp *)(ulong)*puVar8,number);
    Formatter::operator()
              ((Formatter *)local_58,"    case $1$:\n",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &name_to_number._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string
              ((string *)&name_to_number._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::_Rb_tree_const_iterator<int>::operator++(&local_c8);
  }
  Formatter::operator()<>
            ((Formatter *)local_58,
             "      return true;\n    default:\n      return false;\n  }\n}\n\n");
  pFVar7 = EnumDescriptor::file(this->descriptor_);
  bVar3 = HasDescriptorMethods(pFVar7,this->options_);
  if (!bVar3) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *)&number_to_canonical_name._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_150);
    value_1._4_4_ = 0;
    while( true ) {
      iVar2 = value_1._4_4_;
      uVar5 = EnumDescriptor::value_count(this->descriptor_);
      __k = (reference)(ulong)uVar5;
      if ((int)uVar5 <= iVar2) break;
      local_160 = EnumDescriptor::value(this->descriptor_,value_1._4_4_);
      psVar9 = EnumValueDescriptor::name_abi_cxx11_(local_160);
      local_164 = EnumValueDescriptor::number(local_160);
      pVar14 = std::
               map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
               ::emplace<std::__cxx11::string_const&,int>
                         ((map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                           *)&number_to_canonical_name._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count,psVar9,&local_164);
      local_178 = (_Base_ptr)pVar14.first._M_node;
      local_170 = pVar14.second;
      local_17c = EnumValueDescriptor::number(local_160);
      psVar9 = EnumValueDescriptor::name_abi_cxx11_(local_160);
      pVar15 = std::
               map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
               ::emplace<int,std::__cxx11::string_const&>
                         ((map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                           *)local_150,&local_17c,psVar9);
      local_190 = (_Base_ptr)pVar15.first._M_node;
      local_188 = pVar15.second;
      value_1._4_4_ = value_1._4_4_ + 1;
    }
    __range4._4_4_ = anon_unknown_6::CountUniqueValues(this->descriptor_);
    Formatter::operator()
              ((Formatter *)local_58,
               "static ::$proto_ns$::internal::ExplicitlyConstructed<std::string> $classname$_strings[$1$] = {};\n\n"
               ,(int *)((long)&__range4 + 4));
    Formatter::operator()<>((Formatter *)local_58,"static const char $classname$_names[] =");
    psVar1 = &number_to_canonical_name._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *)psVar1);
    p = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)psVar1);
    while (bVar3 = std::operator!=(&__end4,(_Self *)&p), bVar3) {
      args = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator*(&__end4);
      Formatter::operator()((Formatter *)local_58,"\n  \"$1$\"",&args->first);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
      ::operator++(&__end4);
    }
    Formatter::operator()<>((Formatter *)local_58,";\n\n");
    Formatter::operator()<>
              ((Formatter *)local_58,
               "static const ::$proto_ns$::internal::EnumEntry $classname$_entries[] = {\n");
    number_to_index._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               local_1f0);
    __range4_1._4_4_ = 0;
    psVar1 = &number_to_canonical_name._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end4_1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *)psVar1);
    p_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)psVar1);
    while (bVar3 = std::operator!=(&__end4_1,(_Self *)&p_1), bVar3) {
      local_218 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                  ::operator*(&__end4_1);
      local_220 = std::__cxx11::string::size();
      Formatter::operator()
                ((Formatter *)local_58,"  { {$classname$_names + $1$, $2$}, $3$ },\n",
                 (int *)((long)&__range4_1 + 4),&local_220,&local_218->second);
      pmVar10 = std::
                map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_150,&local_218->second);
      _Var4 = std::operator==(pmVar10,&local_218->first);
      if (_Var4) {
        std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>::
        emplace<int_const&,int&>
                  ((map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>> *)local_1f0
                   ,&local_218->second,
                   (int *)((long)&number_to_index._M_t._M_impl.super__Rb_tree_header._M_node_count +
                          4));
      }
      number_to_index._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           number_to_index._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1;
      __k = (reference)std::__cxx11::string::size();
      __range4_1._4_4_ = __range4_1._4_4_ + (int)__k;
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
      ::operator++(&__end4_1);
    }
    Formatter::operator()<>
              ((Formatter *)local_58,"};\n\nstatic const int $classname$_entries_by_number[] = {\n")
    ;
    __end4_2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               begin((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     local_1f0);
    p_2 = (pair<const_int,_int> *)
          std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                    ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     local_1f0);
    while( true ) {
      qualified = SUB81(__k,0);
      bVar3 = std::operator!=(&__end4_2,(_Self *)&p_2);
      if (!bVar3) break;
      __k = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator*(&__end4_2);
      pmVar10 = std::
                map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_150,&__k->first);
      Formatter::operator()
                ((Formatter *)local_58,"  $1$, // $2$ -> $3$\n",&__k->second,&__k->first,pmVar10);
      std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++(&__end4_2);
    }
    Formatter::operator()<>((Formatter *)local_58,"};\n\n");
    parent.field_2._12_4_ = anon_unknown_6::CountUniqueValues(this->descriptor_);
    Formatter::operator()
              ((Formatter *)local_58,
               "const std::string& $classname$_Name(\n    $classname$ value) {\n  static const bool dummy =\n      ::$proto_ns$::internal::InitializeEnumStrings(\n          $classname$_entries,\n          $classname$_entries_by_number,\n          $1$, $classname$_strings);\n  (void) dummy;\n  int idx = ::$proto_ns$::internal::LookUpEnumName(\n      $classname$_entries,\n      $classname$_entries_by_number,\n      $1$, value);\n  return idx == -1 ? ::$proto_ns$::internal::GetEmptyString() :\n                     $classname$_strings[idx].get();\n}\n"
               ,(int *)(parent.field_2._M_local_buf + 0xc));
    parent.field_2._8_4_ = EnumDescriptor::value_count(this->descriptor_);
    Formatter::operator()
              ((Formatter *)local_58,
               "bool $classname$_Parse(\n    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, $classname$* value) {\n  int int_value;\n  bool success = ::$proto_ns$::internal::LookUpEnumValue(\n      $classname$_entries, $1$, name, &int_value);\n  if (success) {\n    *value = static_cast<$classname$>(int_value);\n  }\n  return success;\n}\n"
               ,(int *)(parent.field_2._M_local_buf + 8));
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               local_1f0);
    std::
    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_150);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *)&number_to_canonical_name._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  pDVar11 = EnumDescriptor::containing_type(this->descriptor_);
  if (pDVar11 != (Descriptor *)0x0) {
    pDVar11 = EnumDescriptor::containing_type(this->descriptor_);
    ClassName_abi_cxx11_((string *)local_278,(cpp *)pDVar11,(Descriptor *)0x0,(bool)qualified);
    Formatter::operator()<>
              ((Formatter *)local_58,
               "#if (__cplusplus < 201703) && (!defined(_MSC_VER) || (_MSC_VER >= 1900 && _MSC_VER < 1912))\n"
              );
    for (local_27c = 0; iVar2 = local_27c, iVar6 = EnumDescriptor::value_count(this->descriptor_),
        iVar2 < iVar6; local_27c = local_27c + 1) {
      this_00 = EnumDescriptor::value(this->descriptor_,local_27c);
      EnumValueName_abi_cxx11_(&local_2a0,(cpp *)this_00,enum_value);
      Formatter::operator()
                ((Formatter *)local_58,"constexpr $classname$ $1$::$2$;\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                 &local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
    }
    Formatter::operator()
              ((Formatter *)local_58,
               "constexpr $classname$ $1$::$nested_name$_MIN;\nconstexpr $classname$ $1$::$nested_name$_MAX;\n"
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278);
    if ((this->generate_array_size_ & 1U) != 0) {
      Formatter::operator()
                ((Formatter *)local_58,"constexpr int $1$::$nested_name$_ARRAYSIZE;\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278);
    }
    Formatter::operator()<>
              ((Formatter *)local_58,
               "#endif  // (__cplusplus < 201703) && (!defined(_MSC_VER) || (_MSC_VER >= 1900 && _MSC_VER < 1912))\n"
              );
    std::__cxx11::string::~string((string *)local_278);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
  Formatter::~Formatter((Formatter *)local_58);
  return;
}

Assistant:

void EnumGenerator::GenerateMethods(int idx, io::Printer* printer) {
  Formatter format(printer, variables_);
  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    format(
        "const ::$proto_ns$::EnumDescriptor* $classname$_descriptor() {\n"
        "  ::$proto_ns$::internal::AssignDescriptors(&$desc_table$);\n"
        "  return $file_level_enum_descriptors$[$1$];\n"
        "}\n",
        idx);
  }

  format(
      "bool $classname$_IsValid(int value) {\n"
      "  switch (value) {\n");

  // Multiple values may have the same number.  Make sure we only cover
  // each number once by first constructing a set containing all valid
  // numbers, then printing a case statement for each element.

  std::set<int> numbers;
  for (int j = 0; j < descriptor_->value_count(); j++) {
    const EnumValueDescriptor* value = descriptor_->value(j);
    numbers.insert(value->number());
  }

  for (std::set<int>::iterator iter = numbers.begin(); iter != numbers.end();
       ++iter) {
    format("    case $1$:\n", Int32ToString(*iter));
  }

  format(
      "      return true;\n"
      "    default:\n"
      "      return false;\n"
      "  }\n"
      "}\n"
      "\n");

  if (!HasDescriptorMethods(descriptor_->file(), options_)) {
    // In lite mode (where descriptors are unavailable), we generate separate
    // tables for mapping between enum names and numbers. The _entries table
    // contains the bulk of the data and is sorted by name, while
    // _entries_by_number is sorted by number and just contains pointers into
    // _entries. The two tables allow mapping from name to number and number to
    // name, both in time logarithmic in the number of enum entries. This could
    // probably be made faster, but for now the tables are intended to be simple
    // and compact.
    //
    // Enums with allow_alias = true support multiple entries with the same
    // numerical value. In cases where there are multiple names for the same
    // number, we treat the first name appearing in the .proto file as the
    // canonical one.
    std::map<std::string, int> name_to_number;
    std::map<int, std::string> number_to_canonical_name;
    for (int i = 0; i < descriptor_->value_count(); i++) {
      const EnumValueDescriptor* value = descriptor_->value(i);
      name_to_number.emplace(value->name(), value->number());
      // The same number may appear with multiple names, so we use emplace() to
      // let the first name win.
      number_to_canonical_name.emplace(value->number(), value->name());
    }

    format(
        "static ::$proto_ns$::internal::ExplicitlyConstructed<std::string> "
        "$classname$_strings[$1$] = {};\n\n",
        CountUniqueValues(descriptor_));

    // We concatenate all the names for a given enum into one big string
    // literal. If instead we store an array of string literals, the linker
    // seems to put all enum strings for a given .proto file in the same
    // section, which hinders its ability to strip out unused strings.
    format("static const char $classname$_names[] =");
    for (const auto& p : name_to_number) {
      format("\n  \"$1$\"", p.first);
    }
    format(";\n\n");

    format(
        "static const ::$proto_ns$::internal::EnumEntry $classname$_entries[] "
        "= {\n");
    int i = 0;
    std::map<int, int> number_to_index;
    int data_index = 0;
    for (const auto& p : name_to_number) {
      format("  { {$classname$_names + $1$, $2$}, $3$ },\n", data_index,
             p.first.size(), p.second);
      if (number_to_canonical_name[p.second] == p.first) {
        number_to_index.emplace(p.second, i);
      }
      ++i;
      data_index += p.first.size();
    }

    format(
        "};\n"
        "\n"
        "static const int $classname$_entries_by_number[] = {\n");
    for (const auto& p : number_to_index) {
      format("  $1$, // $2$ -> $3$\n", p.second, p.first,
             number_to_canonical_name[p.first]);
    }
    format(
        "};\n"
        "\n");

    format(
        "const std::string& $classname$_Name(\n"
        "    $classname$ value) {\n"
        "  static const bool dummy =\n"
        "      ::$proto_ns$::internal::InitializeEnumStrings(\n"
        "          $classname$_entries,\n"
        "          $classname$_entries_by_number,\n"
        "          $1$, $classname$_strings);\n"
        "  (void) dummy;\n"
        "  int idx = ::$proto_ns$::internal::LookUpEnumName(\n"
        "      $classname$_entries,\n"
        "      $classname$_entries_by_number,\n"
        "      $1$, value);\n"
        "  return idx == -1 ? ::$proto_ns$::internal::GetEmptyString() :\n"
        "                     $classname$_strings[idx].get();\n"
        "}\n",
        CountUniqueValues(descriptor_));
    format(
        "bool $classname$_Parse(\n"
        "    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, $classname$* "
        "value) "
        "{\n"
        "  int int_value;\n"
        "  bool success = ::$proto_ns$::internal::LookUpEnumValue(\n"
        "      $classname$_entries, $1$, name, &int_value);\n"
        "  if (success) {\n"
        "    *value = static_cast<$classname$>(int_value);\n"
        "  }\n"
        "  return success;\n"
        "}\n",
        descriptor_->value_count());
  }

  if (descriptor_->containing_type() != NULL) {
    std::string parent = ClassName(descriptor_->containing_type(), false);
    // Before C++17, we must define the static constants which were
    // declared in the header, to give the linker a place to put them.
    // But MSVC++ pre-2015 and post-2017 (version 15.5+) insists that we not.
    format(
        "#if (__cplusplus < 201703) && "
        "(!defined(_MSC_VER) || (_MSC_VER >= 1900 && _MSC_VER < 1912))\n");

    for (int i = 0; i < descriptor_->value_count(); i++) {
      format("constexpr $classname$ $1$::$2$;\n", parent,
             EnumValueName(descriptor_->value(i)));
    }
    format(
        "constexpr $classname$ $1$::$nested_name$_MIN;\n"
        "constexpr $classname$ $1$::$nested_name$_MAX;\n",
        parent);
    if (generate_array_size_) {
      format("constexpr int $1$::$nested_name$_ARRAYSIZE;\n", parent);
    }

    format(
        "#endif  // (__cplusplus < 201703) && "
        "(!defined(_MSC_VER) || (_MSC_VER >= 1900 && _MSC_VER < 1912))\n");
  }
}